

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_each.cpp
# Opt level: O1

void __thiscall tst_qpromise_each::delayedRejected(tst_qpromise_each *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  char16_t *this_00;
  PromiseResolver<void> PVar3;
  bool bVar4;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseData<QList<int>_> *pPVar5;
  QPromiseReject<QList<int>_> *reject;
  QByteArrayView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  PromiseResolver<QList<int>_> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_128;
  QString local_120;
  QPromise<QList<int>_> p;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_d8;
  QSharedData *local_d0;
  QString local_c8;
  PromiseResolver<void> resolver;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  QArrayData *local_68;
  storage_type_conflict *local_60;
  qsizetype local_58;
  _Any_data local_50;
  code *local_40;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_60 = (storage_type_conflict *)QArrayData::allocate(&local_68,4,8,3,KeepSize);
  local_60[0] = L'*';
  local_60[1] = L'\0';
  local_60[2] = L'+';
  local_60[3] = L'\0';
  local_60[4] = L',';
  local_60[5] = L'\0';
  local_58 = 3;
  QtPromise::QPromiseBase<QList<int>_>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            ((QPromiseBase<QList<int>_> *)&local_c8,(QList<int> *)&local_68);
  this_00 = local_c8.d.ptr;
  local_c8.d.d = (Data *)&PTR__QPromiseBase_00160308;
  if ((PromiseData<QList<int>_> *)local_c8.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_c8.d.ptr)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00160560;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001604f8;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_d0 = &this_01->super_QSharedData;
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00160490;
  local_f8.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_f8);
  local_f8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001604d8;
  if ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_f8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_f8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_f8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar3.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_120.d.d = (Data *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data>)
       resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  local_88._M_unused._0_8_)->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_88._M_unused._0_8_ + 8))->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d == (Data *)0x0) {
    pcStack_70 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    pcStack_70 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00,
             (function<void_(const_QList<int>_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_120,
             (QPromiseResolve<void> *)&resolver_1,(QPromiseReject<void> *)reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  if ((Data *)local_120.d.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_120.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_120.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_120.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_120.d.d != (Data *)0x0)) {
      operator_delete(local_120.d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar4 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00);
  }
  LOCK();
  pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00)->super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00)->super_QSharedData;
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001602d8;
  pPVar5 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001603b8;
  QReadWriteLock::QReadWriteLock
            (&(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00160340;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar5->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar5 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar5->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_120.d.d = (Data *)&PTR__QPromiseBase_00160308;
  local_120.d.ptr = (char16_t *)pPVar5;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar5;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_1,(QPromise<QList<int>_> *)&local_120);
  local_120.d.d = (Data *)&PTR__QPromiseBase_001602d8;
  if ((PromiseData<QList<int>_> *)local_120.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_120.d.ptr)->
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_120.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_120.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_128 = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_d8 = resolver_1.m_d.d;
  local_f8.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_f8.super__Function_base._M_functor._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_f8._M_invoker = (_Invoker_type)this_00;
  LOCK();
  pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00)->super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_f8.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_00160308;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_f8.super__Function_base._M_functor._M_unused._M_object;
  if ((Data *)local_f8.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f8.super__Function_base._M_functor._M_unused._0_8_ =
         *local_f8.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise =
       (QPromise<void> *)local_f8.super__Function_base._M_functor._8_8_;
  if ((Data *)local_f8.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f8.super__Function_base._M_functor._8_8_ =
         *(int *)local_f8.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_001602d8;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<void> *)local_f8._M_invoker;
  if ((PromiseData<QList<int>_> *)local_f8._M_invoker != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_f8._M_invoker)->
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00160308;
  local_f8.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_001602d8;
  if ((PromiseData<QList<int>_> *)local_f8._M_invoker != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_f8._M_invoker)->
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_f8._M_invoker != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_f8._M_invoker)->
        _vptr_PromiseDataBase[1])();
    }
  }
  if ((Data *)local_f8.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f8.super__Function_base._M_functor._8_8_ =
         *(int *)local_f8.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_f8.super__Function_base._M_functor._8_8_ == 0) &&
       ((Data *)local_f8.super__Function_base._M_functor._8_8_ != (Data *)0x0)) {
      operator_delete((void *)local_f8.super__Function_base._M_functor._8_8_,0x10);
    }
  }
  if ((Data *)local_f8.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_f8.super__Function_base._M_functor._M_unused._0_8_ =
         *local_f8.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_f8.super__Function_base._M_functor._M_unused._M_object == 0) &&
       ((Data *)local_f8.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0)) {
      operator_delete(local_f8.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_01,(function<void_()> *)&resolver);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            (&local_f8,(PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<QList<int>_> *)&local_d8,reject);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher(this_01,&local_f8);
  if ((undefined **)local_f8.super__Function_base._M_manager != (undefined **)0x0) {
    (*local_f8.super__Function_base._M_manager)
              ((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  if (local_d8.d != (Data *)0x0) {
    LOCK();
    ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_d8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_d8.d != (Data *)0x0)) {
      operator_delete(local_d8.d,0x10);
    }
  }
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_128.d != (Data *)0x0)) {
      operator_delete(local_128.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00160308;
  bVar4 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar4) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00)->_vptr_PromiseDataBase[1])
              (this_00);
  }
  LOCK();
  (local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this_00)->_vptr_PromiseDataBase[1])
              (this_00);
  }
  local_c8.d.d = (Data *)&PTR__QPromiseBase_001602d8;
  if ((PromiseData<QList<int>_> *)local_c8.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_c8.d.ptr)->
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_c8.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_c8.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,4,8);
    }
  }
  local_c8.d.d = (Data *)0x0;
  local_c8.d.ptr = (char16_t *)0x0;
  local_c8.d.size = 0;
  waitForError<QList<int>,QString>(&local_120,&p,&local_c8);
  QVar6.m_data = (storage_type *)0x3;
  QVar6.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar6);
  QVar7.m_data = local_120.d.ptr;
  QVar7.m_size = local_120.d.size;
  QVar8.m_data = local_60;
  QVar8.m_size = local_58;
  QTest::qCompare(QVar7,QVar8,"waitForError(p, QString{})","QString{\"foo\"}",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_each.cpp"
                  ,0x87);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,8);
    }
  }
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001602d8;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_each::functorThrows()
{
    auto p = QtPromise::QPromise<QVector<int>>::resolve({42, 43, 44}).each([](int v, ...) {
        if (v == 44) {
            throw QString{"foo"};
        }
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
}